

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsqlfield.cpp
# Opt level: O0

void QSqlField::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  RequiredStatus RVar2;
  int iVar3;
  QMetaType QVar4;
  QSqlField *this;
  long *in_RCX;
  uint in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  void *_v_1;
  void *_v;
  QSqlField *_t;
  QSqlField *in_stack_ffffffffffffff38;
  QSqlField *in_stack_ffffffffffffff40;
  QSqlField *in_stack_ffffffffffffff48;
  QSqlField *in_stack_ffffffffffffff50;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 1) {
    in_stack_ffffffffffffff50 = (QSqlField *)*in_RCX;
    in_stack_ffffffffffffff40 = (QSqlField *)(ulong)in_EDX;
    switch(in_stack_ffffffffffffff40) {
    case (QSqlField *)0x0:
      value(in_stack_ffffffffffffff38);
      QVariant::operator=(&in_stack_ffffffffffffff48->val,&in_stack_ffffffffffffff40->val);
      QVariant::~QVariant(&local_28);
      break;
    case (QSqlField *)0x1:
      defaultValue(in_stack_ffffffffffffff48);
      QVariant::operator=(&in_stack_ffffffffffffff48->val,&in_stack_ffffffffffffff40->val);
      QVariant::~QVariant(&local_48);
      break;
    case (QSqlField *)0x2:
      name(in_stack_ffffffffffffff48);
      QString::operator=((QString *)in_stack_ffffffffffffff40,(QString *)in_stack_ffffffffffffff38);
      QString::~QString((QString *)0x133cbd);
      break;
    case (QSqlField *)0x3:
      tableName(in_stack_ffffffffffffff48);
      QString::operator=((QString *)in_stack_ffffffffffffff40,(QString *)in_stack_ffffffffffffff38);
      QString::~QString((QString *)0x133cea);
      break;
    case (QSqlField *)0x4:
      QVar4 = metaType(in_stack_ffffffffffffff40);
      (in_stack_ffffffffffffff50->val).d.data.shared = (PrivateShared *)QVar4.d_ptr;
      break;
    case (QSqlField *)0x5:
      RVar2 = requiredStatus((QSqlField *)0x133d1a);
      *(RequiredStatus *)&(in_stack_ffffffffffffff50->val).d.data = RVar2;
      break;
    case (QSqlField *)0x6:
      bVar1 = isReadOnly((QSqlField *)0x133d2f);
      (in_stack_ffffffffffffff50->val).d.data.data[0] = bVar1;
      break;
    case (QSqlField *)0x7:
      bVar1 = isGenerated((QSqlField *)0x133d47);
      (in_stack_ffffffffffffff50->val).d.data.data[0] = bVar1;
      break;
    case (QSqlField *)0x8:
      bVar1 = isAutoValue((QSqlField *)0x133d5f);
      (in_stack_ffffffffffffff50->val).d.data.data[0] = bVar1;
      break;
    case (QSqlField *)0x9:
      iVar3 = length((QSqlField *)0x133d77);
      *(int *)&(in_stack_ffffffffffffff50->val).d.data = iVar3;
      break;
    case (QSqlField *)0xa:
      iVar3 = precision((QSqlField *)0x133d8c);
      *(int *)&(in_stack_ffffffffffffff50->val).d.data = iVar3;
    }
  }
  if (in_ESI == 2) {
    QVar4.d_ptr = (QMetaTypeInterface *)*in_RCX;
    this = (QSqlField *)(ulong)in_EDX;
    switch(this) {
    case (QSqlField *)0x0:
      setValue(in_stack_ffffffffffffff40,(QVariant *)this);
      break;
    case (QSqlField *)0x1:
      setDefaultValue(in_stack_ffffffffffffff50,(QVariant *)QVar4.d_ptr);
      break;
    case (QSqlField *)0x2:
      setName(in_stack_ffffffffffffff50,(QString *)QVar4.d_ptr);
      break;
    case (QSqlField *)0x3:
      setTableName(in_stack_ffffffffffffff50,(QString *)QVar4.d_ptr);
      break;
    case (QSqlField *)0x4:
      setMetaType(this,QVar4);
      break;
    case (QSqlField *)0x5:
      setRequiredStatus(in_stack_ffffffffffffff40,Optional);
      break;
    case (QSqlField *)0x6:
      setReadOnly(in_stack_ffffffffffffff40,false);
      break;
    case (QSqlField *)0x7:
      setGenerated(in_stack_ffffffffffffff40,false);
      break;
    case (QSqlField *)0x8:
      setAutoValue(in_stack_ffffffffffffff40,false);
      break;
    case (QSqlField *)0x9:
      setLength(in_stack_ffffffffffffff40,0);
      break;
    case (QSqlField *)0xa:
      setPrecision(in_stack_ffffffffffffff40,0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSqlField::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = reinterpret_cast<QSqlField *>(_o);
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QVariant*>(_v) = _t->value(); break;
        case 1: *reinterpret_cast<QVariant*>(_v) = _t->defaultValue(); break;
        case 2: *reinterpret_cast<QString*>(_v) = _t->name(); break;
        case 3: *reinterpret_cast<QString*>(_v) = _t->tableName(); break;
        case 4: *reinterpret_cast<QMetaType*>(_v) = _t->metaType(); break;
        case 5: *reinterpret_cast<RequiredStatus*>(_v) = _t->requiredStatus(); break;
        case 6: *reinterpret_cast<bool*>(_v) = _t->isReadOnly(); break;
        case 7: *reinterpret_cast<bool*>(_v) = _t->isGenerated(); break;
        case 8: *reinterpret_cast<bool*>(_v) = _t->isAutoValue(); break;
        case 9: *reinterpret_cast<int*>(_v) = _t->length(); break;
        case 10: *reinterpret_cast<int*>(_v) = _t->precision(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setValue(*reinterpret_cast<QVariant*>(_v)); break;
        case 1: _t->setDefaultValue(*reinterpret_cast<QVariant*>(_v)); break;
        case 2: _t->setName(*reinterpret_cast<QString*>(_v)); break;
        case 3: _t->setTableName(*reinterpret_cast<QString*>(_v)); break;
        case 4: _t->setMetaType(*reinterpret_cast<QMetaType*>(_v)); break;
        case 5: _t->setRequiredStatus(*reinterpret_cast<RequiredStatus*>(_v)); break;
        case 6: _t->setReadOnly(*reinterpret_cast<bool*>(_v)); break;
        case 7: _t->setGenerated(*reinterpret_cast<bool*>(_v)); break;
        case 8: _t->setAutoValue(*reinterpret_cast<bool*>(_v)); break;
        case 9: _t->setLength(*reinterpret_cast<int*>(_v)); break;
        case 10: _t->setPrecision(*reinterpret_cast<int*>(_v)); break;
        default: break;
        }
    }
}